

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O2

size_t zt_hex_to_binary(char *hex,size_t hlen,void *data,size_t dlen)

{
  int8_t iVar1;
  int8_t iVar2;
  int *piVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = 0;
  uVar4 = 0;
  while( true ) {
    if (hlen <= uVar5) {
      return uVar4;
    }
    if (*hex == '\0') {
      return uVar4;
    }
    if ((-(ulong)(data == (void *)0x0) | dlen) <= uVar4) {
      return uVar4;
    }
    iVar1 = hex_to_char(*hex);
    if (iVar1 == -1) break;
    iVar2 = hex_to_char(hex[1]);
    if (iVar2 == -1) {
      return 0;
    }
    if (data != (void *)0x0) {
      *(int8_t *)((long)data + uVar4) = iVar2 + iVar1 * '\x10';
    }
    hex = hex + 2;
    uVar4 = uVar4 + 1;
    uVar5 = uVar5 + 2;
  }
  piVar3 = __errno_location();
  *piVar3 = 0x16;
  return 0;
}

Assistant:

size_t
zt_hex_to_binary(char *hex, size_t hlen, void *data, size_t dlen) {
    size_t n;
    size_t y = 0;

    if (data == NULL) {
        dlen = -1;
    }

    for (n = 0, y = 0; n < hlen && *hex != '\0' && y < dlen; n++) {
        int8_t c;
        int8_t c2;
        int8_t cc = 0;

        if ((c = hex_to_char(*hex++)) == -1) {
            errno = EINVAL;
            return 0;
        }

        if ((c2 = hex_to_char(*hex++)) == -1) {
            return 0;
        } else {
            n++;
        }

        cc = (c << 4) | (c2 & 0xF);

        if (data != NULL) {
            ((char *)data)[y] = (char)cc;
        }
        y++;
    }
    return y;
}